

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

void fdb_free_cmp_func_list(list *cmp_func_list)

{
  list_elem *e;
  list_elem *plVar1;
  
  if (cmp_func_list != (list *)0x0) {
    e = cmp_func_list->head;
    while (e != (list_elem *)0x0) {
      plVar1 = list_remove(cmp_func_list,e);
      free(e[-2].next);
      free(&e[-2].next);
      e = plVar1;
    }
  }
  return;
}

Assistant:

void fdb_free_cmp_func_list(struct list *cmp_func_list)
{
    if (!cmp_func_list) {
        return;
    }

    struct cmp_func_node *cmp_node;
    struct list_elem *e = list_begin(cmp_func_list);
    while (e) {
        cmp_node = _get_entry(e, struct cmp_func_node, le);
        e = list_remove(cmp_func_list, &cmp_node->le);
        free(cmp_node->kvs_name);
        free(cmp_node);
    }
}